

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  *(undefined ***)&this->field_0xd8 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0xe0 = 0;
  *(char **)&this->field_0xe8 = "IfcRelContainedInSpatialStructure";
  IfcRelConnects::IfcRelConnects(&this->super_IfcRelConnects,&PTR_construction_vtable_24__0082b6c0);
  *(undefined8 *)&(this->super_IfcRelConnects).field_0xb0 = 0;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x82b608;
  *(undefined8 *)&this->field_0xd8 = 0x82b6a8;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       0x82b630;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       0x82b658;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = 0x82b680;
  *(undefined8 *)&(this->super_IfcRelConnects).field_0xb8 = 0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(undefined8 *)&this->field_0xc8 = 0;
  (this->RelatingStructure).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}